

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

iterator __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
erase(RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      *this,const_iterator first,const_iterator last)

{
  iterator iVar1;
  RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RDX;
  size_type last_offset;
  size_type pos_offset;
  int in_stack_000000a8;
  int in_stack_000000ac;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_000000b0;
  iterator in_stack_ffffffffffffff98;
  RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffa8;
  RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffb0;
  
  cbegin((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_ffffffffffffff98.it_);
  std::distance<google::protobuf::internal::RepeatedPtrIterator<std::__cxx11::string_const>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  cbegin((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_ffffffffffffff98.it_);
  std::distance<google::protobuf::internal::RepeatedPtrIterator<std::__cxx11::string_const>>
            (in_RDX,in_stack_ffffffffffffffa8);
  DeleteSubrange(in_stack_000000b0,in_stack_000000ac,in_stack_000000a8);
  begin((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)in_stack_ffffffffffffff98.it_);
  iVar1 = internal::operator+(in_stack_ffffffffffffff98,0x3fccf4);
  return (iterator)iVar1.it_;
}

Assistant:

inline typename RepeatedPtrField<Element>::iterator
RepeatedPtrField<Element>::erase(const_iterator first, const_iterator last) {
  size_type pos_offset = std::distance(cbegin(), first);
  size_type last_offset = std::distance(cbegin(), last);
  DeleteSubrange(pos_offset, last_offset - pos_offset);
  return begin() + pos_offset;
}